

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlspwin.c
# Opt level: O2

void Create_LispWindow(DspInterface dsp)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  Window WVar7;
  GC p_Var8;
  Pixmap PVar9;
  long lVar10;
  char *pcVar11;
  uint uVar12;
  int iVar13;
  char *__format;
  Display *pDVar14;
  int iVar15;
  long lVar16;
  undefined8 *puVar17;
  char *IT;
  char *WT;
  XTextProperty WindowNameText;
  XClassHint xclasshint;
  XColor backgroundColor_xcsd;
  XColor foregroundColor_xcsd;
  XSetWindowAttributes Lisp_SetWinAttributes;
  XTextProperty IconText;
  XWMHints Lisp_WMhints;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  XGCValues gcv;
  
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_e8 = 0;
  uStack_e0 = 0;
  local_f8 = 0;
  uStack_f0 = 0;
  local_108 = 0;
  uStack_100 = 0;
  Lisp_WMhints.icon_x = 0;
  Lisp_WMhints.icon_y = 0;
  Lisp_WMhints.icon_mask = 0;
  Lisp_WMhints.icon_pixmap = 0;
  Lisp_WMhints.icon_window = 0;
  Lisp_WMhints.window_group = 0;
  Lisp_WMhints.flags = 0;
  Lisp_WMhints.input = 0;
  Lisp_WMhints.initial_state = 0;
  xclasshint.res_name = (char *)0x0;
  xclasshint.res_class = (char *)0x0;
  IconText.format = 0;
  IconText._20_4_ = 0;
  IconText.nitems = 0;
  IconText.value = (uchar *)0x0;
  IconText.encoding = 0;
  WindowNameText.format = 0;
  WindowNameText._20_4_ = 0;
  WindowNameText.nitems = 0;
  WindowNameText.value = (uchar *)0x0;
  WindowNameText.encoding = 0;
  Lisp_SetWinAttributes.colormap = 0;
  Lisp_SetWinAttributes.cursor = 0;
  Lisp_SetWinAttributes.do_not_propagate_mask = 0;
  Lisp_SetWinAttributes.override_redirect = 0;
  Lisp_SetWinAttributes._92_4_ = 0;
  Lisp_SetWinAttributes.save_under = 0;
  Lisp_SetWinAttributes._68_4_ = 0;
  Lisp_SetWinAttributes.event_mask = 0;
  Lisp_SetWinAttributes.backing_planes = 0;
  Lisp_SetWinAttributes.backing_pixel = 0;
  Lisp_SetWinAttributes.bit_gravity = 0;
  Lisp_SetWinAttributes.win_gravity = 0;
  Lisp_SetWinAttributes.backing_store = 0;
  Lisp_SetWinAttributes._44_4_ = 0;
  Lisp_SetWinAttributes.border_pixmap = 0;
  Lisp_SetWinAttributes.border_pixel = 0;
  Lisp_SetWinAttributes.background_pixmap = 0;
  Lisp_SetWinAttributes.background_pixel = 0;
  gcv.clip_mask = 0;
  gcv.dash_offset = 0;
  gcv.dashes = '\0';
  gcv._125_3_ = 0;
  gcv.subwindow_mode = 0;
  gcv.graphics_exposures = 0;
  gcv.clip_x_origin = 0;
  gcv.clip_y_origin = 0;
  gcv.ts_x_origin = 0;
  gcv.ts_y_origin = 0;
  gcv.font = 0;
  gcv.tile = 0;
  gcv.stipple = 0;
  gcv.fill_style = 0;
  gcv.fill_rule = 0;
  gcv.arc_mode = 0;
  gcv._60_4_ = 0;
  gcv.line_width = 0;
  gcv.line_style = 0;
  gcv.cap_style = 0;
  gcv.join_style = 0;
  gcv.foreground = 0;
  gcv.background = 0;
  gcv.function = 0;
  gcv._4_4_ = 0;
  gcv.plane_mask = 0;
  WT = windowTitle;
  IT = iconTitle;
  uVar12 = dsp->ScrollBarWidth;
  uVar3 = dsp->InternalBorderWidth;
  uVar4 = (dsp->Visible).width;
  uVar5 = (dsp->Visible).height;
  pDVar14 = dsp->display_id;
  lVar10 = *(long *)(pDVar14 + 0xe8);
  lVar16 = (long)*(int *)(pDVar14 + 0xe0) * 0x80;
  foregroundPixel = *(unsigned_long *)(lVar10 + 0x60 + lVar16);
  backgroundPixel = *(unsigned_long *)(lVar10 + 0x58 + lVar16);
  if (foregroundColorName[0] != '\0') {
    iVar6 = XAllocNamedColor(pDVar14,Colors,foregroundColorName,&foregroundColor_xcsd,
                             &foregroundColor_xcsd);
    if (iVar6 == 0) {
      __format = "Color allocation failed for foreground color: %s\n";
      pcVar11 = foregroundColorName;
      goto LAB_00138143;
    }
    pDVar14 = dsp->display_id;
    foregroundPixel = foregroundColor_xcsd.pixel;
  }
  if (backgroundColorName[0] != '\0') {
    iVar6 = XAllocNamedColor(pDVar14,Colors,backgroundColorName,&backgroundColor_xcsd,
                             &backgroundColor_xcsd);
    if (iVar6 == 0) {
      __format = "Color allocation failed for background color: %s\n";
      pcVar11 = backgroundColorName;
LAB_00138143:
      fprintf(_stderr,__format,pcVar11);
      exit(1);
    }
    backgroundPixel = backgroundColor_xcsd.pixel;
    pDVar14 = dsp->display_id;
  }
  lVar10 = lVar10 + lVar16;
  iVar6 = dsp->InternalBorderWidth * 2 + dsp->ScrollBarWidth;
  WVar7 = XCreateSimpleWindow(pDVar14,*(undefined8 *)(lVar10 + 0x10),LispWindowRequestedX,
                              LispWindowRequestedY,(dsp->Visible).width + iVar6,
                              iVar6 + (dsp->Visible).height,0,foregroundPixel,backgroundPixel);
  dsp->LispWindow = WVar7;
  Lisp_SetWinAttributes.bit_gravity = dsp->BitGravity;
  Lisp_SetWinAttributes._88_8_ = Lisp_SetWinAttributes._88_8_ & 0xffffffff00000000;
  Lisp_SetWinAttributes.backing_store = *(int *)(lVar10 + 0x70);
  XChangeWindowAttributes(dsp->display_id,WVar7,0x210,&Lisp_SetWinAttributes);
  dsp->DisableEventMask = 0;
  dsp->EnableEventMask = 0x2807f;
  gcv.function = 3;
  gcv.foreground = foregroundPixel;
  gcv.background = backgroundPixel;
  p_Var8 = (GC)XCreateGC(dsp->display_id,dsp->LispWindow,0xd);
  dsp->Copy_GC = p_Var8;
  iVar6 = dsp->InternalBorderWidth * 2 + dsp->ScrollBarWidth;
  uVar1 = (dsp->Display).width;
  uVar2 = (dsp->Display).height;
  local_e8 = CONCAT44(iVar6 + uVar2,iVar6 + uVar1);
  puVar17 = &local_108;
  uStack_f0 = CONCAT44(iVar6,iVar6);
  uStack_c0 = CONCAT44(uStack_c0._4_4_,dsp->BitGravity);
  local_108 = 0x228;
  Lisp_WMhints.icon_pixmap = make_Xicon(dsp);
  Lisp_WMhints.input = 1;
  Lisp_WMhints.flags = 5;
  xclasshint.res_name = *save_argv;
  xclasshint.res_class = xclasshint.res_name;
  XStringListToTextProperty(&WT,1,&WindowNameText);
  XStringListToTextProperty(&IT,1,&IconText);
  XSetWMProperties(dsp->display_id,dsp->LispWindow,&WindowNameText,&IconText,save_argv,save_argc,
                   puVar17,&Lisp_WMhints,&xclasshint);
  XSelectInput(dsp->display_id,dsp->LispWindow,dsp->EnableEventMask);
  init_Xcursor(dsp);
  WVar7 = XCreateSimpleWindow(dsp->display_id,dsp->LispWindow,0,0,(dsp->Visible).width,
                              (dsp->Visible).height,(ulong)puVar17 & 0xffffffff00000000,
                              foregroundPixel,backgroundPixel);
  dsp->DisplayWindow = WVar7;
  XChangeWindowAttributes(dsp->display_id,WVar7,0x250,&Lisp_SetWinAttributes);
  XSelectInput(dsp->display_id,dsp->DisplayWindow,dsp->EnableEventMask);
  XMapWindow(dsp->display_id,dsp->DisplayWindow);
  PVar9 = XCreatePixmapFromBitmapData
                    (dsp->display_id,dsp->LispWindow,check_bits,0x10,0x10,foregroundPixel,
                     backgroundPixel,*(undefined4 *)(lVar10 + 0x38));
  dsp->ScrollBarPixmap = PVar9;
  PVar9 = XCreatePixmapFromBitmapData
                    (dsp->display_id,dsp->LispWindow,check_bits,0x10,0x10,foregroundPixel,
                     backgroundPixel,*(undefined4 *)(lVar10 + 0x38));
  dsp->GravityOnPixmap = PVar9;
  PVar9 = XCreatePixmapFromBitmapData
                    (dsp->display_id,dsp->LispWindow,plain_bits,0x10,0x10,foregroundPixel,
                     backgroundPixel,*(undefined4 *)(lVar10 + 0x38));
  dsp->GravityOffPixmap = PVar9;
  set_Xcursor(dsp,defaultcursor_bitmap,0,0,&DefaultCursor,0);
  set_Xcursor(dsp,waitcursor_bitmap,7,7,&WaitCursor,0);
  set_Xcursor(dsp,scrolldowncursor_bitmap,7,0,&ScrollDownCursor,0);
  set_Xcursor(dsp,"",8,10,&ScrollLeftCursor,0);
  set_Xcursor(dsp,"\x01",7,0,&VertScrollCursor,0);
  set_Xcursor(dsp,"",8,7,&VertThumbCursor,0);
  set_Xcursor(dsp,"",7,10,&HorizScrollCursor,0);
  set_Xcursor(dsp,"",6,7,&HorizThumbCursor,0);
  set_Xcursor(dsp,"",7,10,&ScrollRightCursor,0);
  set_Xcursor(dsp,"\x01",7,0,&ScrollUpCursor,0);
  if (noscroll == 0) {
    uVar12 = uVar12 >> 1;
    iVar15 = uVar12 - uVar3;
    uVar12 = uVar12 + uVar3 & 0x7fffffff;
    iVar6 = uVar5 + uVar12;
    iVar13 = uVar12 + uVar4;
    WVar7 = XCreateSimpleWindow(dsp->display_id,dsp->LispWindow,uVar4,-dsp->InternalBorderWidth,
                                dsp->ScrollBarWidth,(dsp->Visible).height,dsp->InternalBorderWidth,
                                foregroundPixel,backgroundPixel);
    dsp->VerScrollBar = WVar7;
    XDefineCursor(dsp->display_id,WVar7,VertScrollCursor);
    XMapWindow(dsp->display_id,dsp->VerScrollBar);
    WVar7 = XCreateSimpleWindow(dsp->display_id,dsp->LispWindow,-dsp->InternalBorderWidth,uVar5,
                                (dsp->Visible).width,dsp->ScrollBarWidth,dsp->InternalBorderWidth,
                                foregroundPixel,backgroundPixel);
    dsp->HorScrollBar = WVar7;
    XDefineCursor(dsp->display_id,WVar7,HorizScrollCursor);
    XChangeWindowAttributes(dsp->display_id,dsp->HorScrollBar,0x200,&Lisp_SetWinAttributes);
    XMapWindow(dsp->display_id,dsp->HorScrollBar);
    uVar12 = (dsp->Visible).height;
    uVar3 = (dsp->Display).height;
    WVar7 = XCreateSimpleWindow(dsp->display_id,dsp->VerScrollBar,-dsp->InternalBorderWidth,
                                (long)(int)((dsp->Visible).y * uVar12) / (long)(int)uVar3 &
                                0xffffffff,dsp->ScrollBarWidth,(uVar12 * uVar12) / uVar3 + 1,
                                dsp->InternalBorderWidth,foregroundPixel,backgroundPixel);
    dsp->VerScrollButton = WVar7;
    XChangeWindowAttributes(dsp->display_id,WVar7,0x200,&Lisp_SetWinAttributes);
    XSetWindowBackgroundPixmap(dsp->display_id,dsp->VerScrollButton,dsp->ScrollBarPixmap);
    XClearWindow(dsp->display_id,dsp->VerScrollButton);
    XMapWindow(dsp->display_id,dsp->VerScrollButton);
    uVar12 = (dsp->Visible).width;
    uVar3 = (dsp->Display).width;
    WVar7 = XCreateSimpleWindow(dsp->display_id,dsp->HorScrollBar,
                                (long)(int)((dsp->Visible).x * uVar12) / (long)(int)uVar3 &
                                0xffffffff,-dsp->InternalBorderWidth,(uVar12 * uVar12) / uVar3 + 1,
                                dsp->ScrollBarWidth,dsp->InternalBorderWidth,foregroundPixel,
                                backgroundPixel);
    dsp->HorScrollButton = WVar7;
    XChangeWindowAttributes(dsp->display_id,WVar7,0x200,&Lisp_SetWinAttributes);
    XSetWindowBackgroundPixmap(dsp->display_id,dsp->HorScrollButton,dsp->ScrollBarPixmap);
    XClearWindow(dsp->display_id,dsp->HorScrollButton);
    XMapWindow(dsp->display_id,dsp->HorScrollButton);
    WVar7 = XCreateSimpleWindow(dsp->display_id,dsp->LispWindow,uVar4,uVar5,iVar15,iVar15,
                                dsp->InternalBorderWidth,foregroundPixel,backgroundPixel);
    dsp->NWGrav = WVar7;
    XSetWindowBackgroundPixmap(dsp->display_id,WVar7,dsp->GravityOnPixmap);
    XDefineCursor(dsp->display_id,dsp->NWGrav,DefaultCursor);
    XChangeWindowAttributes(dsp->display_id,dsp->NWGrav,0x200,&Lisp_SetWinAttributes);
    XClearWindow(dsp->display_id,dsp->NWGrav);
    XMapWindow(dsp->display_id,dsp->NWGrav);
    WVar7 = XCreateSimpleWindow(dsp->display_id,dsp->LispWindow,iVar13,iVar6,iVar15,iVar15,
                                dsp->InternalBorderWidth,foregroundPixel,backgroundPixel);
    dsp->SEGrav = WVar7;
    XSetWindowBackgroundPixmap(dsp->display_id,WVar7,dsp->GravityOffPixmap);
    XDefineCursor(dsp->display_id,dsp->SEGrav,DefaultCursor);
    XChangeWindowAttributes(dsp->display_id,dsp->SEGrav,0x200,&Lisp_SetWinAttributes);
    XClearWindow(dsp->display_id,dsp->NWGrav);
    XMapWindow(dsp->display_id,dsp->SEGrav);
    WVar7 = XCreateSimpleWindow(dsp->display_id,dsp->LispWindow,uVar4,iVar6,iVar15,iVar15,
                                dsp->InternalBorderWidth,foregroundPixel,backgroundPixel);
    dsp->SWGrav = WVar7;
    XSetWindowBackgroundPixmap(dsp->display_id,WVar7,dsp->GravityOffPixmap);
    XDefineCursor(dsp->display_id,dsp->SWGrav,DefaultCursor);
    XClearWindow(dsp->display_id,dsp->NWGrav);
    XMapWindow(dsp->display_id,dsp->SWGrav);
    WVar7 = XCreateSimpleWindow(dsp->display_id,dsp->LispWindow,iVar13,uVar5,iVar15,iVar15,
                                dsp->InternalBorderWidth,foregroundPixel,backgroundPixel);
    dsp->NEGrav = WVar7;
    XSetWindowBackgroundPixmap(dsp->display_id,WVar7,dsp->GravityOffPixmap);
    XDefineCursor(dsp->display_id,dsp->NEGrav,DefaultCursor);
    XClearWindow(dsp->display_id,dsp->NWGrav);
    XMapWindow(dsp->display_id,dsp->NEGrav);
  }
  XMapWindow(dsp->display_id,dsp->LispWindow);
  XFlush(dsp->display_id);
  return;
}

Assistant:

void Create_LispWindow(DspInterface dsp)
{
  extern char foregroundColorName[];
  extern char backgroundColorName[];
  XColor foregroundColor_xcsd;
  XColor backgroundColor_xcsd;
  Status status;
  XSizeHints szhint = {0};
  XWMHints Lisp_WMhints = {0};
  XClassHint xclasshint = {0};
  XTextProperty IconText = {0}, WindowNameText = {0};
  XSetWindowAttributes Lisp_SetWinAttributes = {0};
  XGCValues gcv = {0};

  Screen *screen;

  unsigned int Col2, Row2, Col3, Row3;
  unsigned int GravSize;
  char *WT, *IT;

  WT = windowTitle;
  IT = iconTitle;

  GravSize = (dsp->ScrollBarWidth / 2) - dsp->InternalBorderWidth;
  Col2 = dsp->Visible.width;
  Row2 = dsp->Visible.height;
  Col3 = dsp->Visible.width + (OUTER_SB_WIDTH(dsp) / 2);
  Row3 = dsp->Visible.height + (OUTER_SB_WIDTH(dsp) / 2);

  screen = ScreenOfDisplay(dsp->display_id, DefaultScreen(dsp->display_id));
  /* set up default display as black on white */
  foregroundPixel = BlackPixelOfScreen(screen); 
  backgroundPixel = WhitePixelOfScreen(screen);
  /* parse and record non-default color specs for foreground and background */
  if (foregroundColorName[0]) {
    status = XAllocNamedColor(dsp->display_id, Colors, foregroundColorName, &foregroundColor_xcsd, &foregroundColor_xcsd);
    if (status == 0) {
      fprintf(stderr, "Color allocation failed for foreground color: %s\n", foregroundColorName);
      exit(1);
    }
    foregroundPixel = foregroundColor_xcsd.pixel;
  }
  if (backgroundColorName[0]) {
    status = XAllocNamedColor(dsp->display_id, Colors, backgroundColorName, &backgroundColor_xcsd, &backgroundColor_xcsd);
    if (status == 0) {
      fprintf(stderr, "Color allocation failed for background color: %s\n", backgroundColorName);
      exit(1);
    }
    backgroundPixel = backgroundColor_xcsd.pixel;
  }
  dsp->LispWindow = XCreateSimpleWindow(
      dsp->display_id, RootWindowOfScreen(screen), LispWindowRequestedX, /* Default upper left */
      LispWindowRequestedY,                                              /* Default upper left */
      dsp->Visible.width + OUTER_SB_WIDTH(dsp),                         /* Default width */
      dsp->Visible.height + OUTER_SB_WIDTH(dsp),                        /* Default height */
      0,                                                                 /* Default border */
      foregroundPixel, backgroundPixel);

  Lisp_SetWinAttributes.bit_gravity = dsp->BitGravity;
  Lisp_SetWinAttributes.override_redirect = False;
  Lisp_SetWinAttributes.backing_store = DoesBackingStore(screen);

  XChangeWindowAttributes(dsp->display_id, dsp->LispWindow, CWBitGravity | CWOverrideRedirect,
                          &Lisp_SetWinAttributes);

  dsp->DisableEventMask = NoEventMask;
  dsp->EnableEventMask = ButtonPressMask | ButtonReleaseMask | EnterWindowMask | LeaveWindowMask |
                         StructureNotifyMask | PointerMotionMask | ExposureMask | KeyPressMask |
                         KeyReleaseMask;

  /* Have to make the GC before we make the icon. */
  gcv.function = GXcopy;
  gcv.foreground = foregroundPixel;
  gcv.background = backgroundPixel;
  dsp->Copy_GC =
      XCreateGC(dsp->display_id, dsp->LispWindow, GCForeground | GCBackground | GCFunction, &gcv);

  szhint.max_width = (int)(dsp->Display.width + OUTER_SB_WIDTH(dsp));
  szhint.max_height = (int)(dsp->Display.height + OUTER_SB_WIDTH(dsp));
  szhint.min_width = (int)OUTER_SB_WIDTH(dsp);
  szhint.min_height = (int)OUTER_SB_WIDTH(dsp);
  szhint.win_gravity = dsp->BitGravity;
  szhint.flags = PMaxSize | PWinGravity | PSize;

  Lisp_WMhints.icon_pixmap = make_Xicon(dsp);
  Lisp_WMhints.input = True;
  Lisp_WMhints.flags = IconPixmapHint | InputHint;

  xclasshint.res_name = *save_argv;
  xclasshint.res_class = *save_argv;

  XStringListToTextProperty(&WT, 1, &WindowNameText);
  XStringListToTextProperty(&IT, 1, &IconText);

  XSetWMProperties(dsp->display_id, dsp->LispWindow, &WindowNameText, &IconText, save_argv,
                   save_argc, &szhint, &Lisp_WMhints, &xclasshint);

  XSelectInput(dsp->display_id, dsp->LispWindow, dsp->EnableEventMask);
  init_Xcursor(dsp);

  dsp->DisplayWindow = XCreateSimpleWindow(dsp->display_id, dsp->LispWindow, 0, 0,
                                           dsp->Visible.width, dsp->Visible.height, 0,
                                           foregroundPixel, backgroundPixel);
  XChangeWindowAttributes(dsp->display_id, dsp->DisplayWindow,
                          CWBitGravity | CWOverrideRedirect | CWBackingStore,
                          &Lisp_SetWinAttributes);
  XSelectInput(dsp->display_id, dsp->DisplayWindow, dsp->EnableEventMask);
  XMapWindow(dsp->display_id, dsp->DisplayWindow);

  /*********************************************************************/
  /* Create all the vanilla pixmaps and cursors for the display window */
  /*********************************************************************/

  dsp->ScrollBarPixmap = XCreatePixmapFromBitmapData(
      dsp->display_id, dsp->LispWindow, (char *)check_bits, check_width, check_height,
      foregroundPixel, backgroundPixel, (unsigned)DefaultDepthOfScreen(screen));
  dsp->GravityOnPixmap = XCreatePixmapFromBitmapData(
      dsp->display_id, dsp->LispWindow, (char *)check_bits, 16, 16, foregroundPixel,
      backgroundPixel, (unsigned)DefaultDepthOfScreen(screen));

  dsp->GravityOffPixmap = XCreatePixmapFromBitmapData(
      dsp->display_id, dsp->LispWindow, (char *)plain_bits, 16, 16, foregroundPixel,
      backgroundPixel, (unsigned)DefaultDepthOfScreen(screen));

  set_Xcursor(dsp, default_cursor.cuimage, (int)default_cursor.cuhotspotx,
              (int)(15 - default_cursor.cuhotspoty), &DefaultCursor, 0);
  set_Xcursor(dsp, wait_cursor.cuimage, (int)wait_cursor.cuhotspotx,
              (int)(15 - wait_cursor.cuhotspoty), &WaitCursor, 0);
  set_Xcursor(dsp, scrolldown_cursor.cuimage, (int)scrolldown_cursor.cuhotspotx,
              (int)(15 - scrolldown_cursor.cuhotspoty), &ScrollDownCursor, 0);
  set_Xcursor(dsp, scrollleft_cursor.cuimage, (int)scrollleft_cursor.cuhotspotx,
              (int)(15 - scrollleft_cursor.cuhotspoty), &ScrollLeftCursor, 0);
  set_Xcursor(dsp, vertscroll_cursor.cuimage, (int)vertscroll_cursor.cuhotspotx,
              (int)(15 - vertscroll_cursor.cuhotspoty), &VertScrollCursor, 0);
  set_Xcursor(dsp, vertthumb_cursor.cuimage, (int)vertthumb_cursor.cuhotspotx,
              (int)(15 - vertthumb_cursor.cuhotspoty), &VertThumbCursor, 0);
  set_Xcursor(dsp, horizscroll_cursor.cuimage, (int)horizscroll_cursor.cuhotspotx,
              (int)(15 - horizscroll_cursor.cuhotspoty), &HorizScrollCursor, 0);
  set_Xcursor(dsp, horizthumb_cursor.cuimage, (int)horizthumb_cursor.cuhotspotx,
              (int)(15 - horizthumb_cursor.cuhotspoty), &HorizThumbCursor, 0);
  set_Xcursor(dsp, scrollright_cursor.cuimage, (int)scrollright_cursor.cuhotspotx,
              (int)(15 - scrollright_cursor.cuhotspoty), &ScrollRightCursor, 0);
  set_Xcursor(dsp, scrollup_cursor.cuimage, (int)scrollup_cursor.cuhotspotx,
              (int)(15 - scrollup_cursor.cuhotspoty), &ScrollUpCursor, 0);

  if (noscroll == 0) {
    /********************************/
    /* Make all the toolkit windows */
    /********************************/
    dsp->VerScrollBar = XCreateSimpleWindow(dsp->display_id, dsp->LispWindow, (int)Col2,
                                            0 - (int)dsp->InternalBorderWidth, /* y */
                                            dsp->ScrollBarWidth,          /* width */
                                            dsp->Visible.height, dsp->InternalBorderWidth,
                                            foregroundPixel, backgroundPixel);
    DefineCursor(dsp, dsp->VerScrollBar, &VertScrollCursor);
    XMapWindow(dsp->display_id, dsp->VerScrollBar);

    dsp->HorScrollBar = XCreateSimpleWindow(dsp->display_id, dsp->LispWindow,
                                            0 - (int)dsp->InternalBorderWidth, (int)Row2, /* y */
                                            dsp->Visible.width,                /* width */
                                            dsp->ScrollBarWidth, dsp->InternalBorderWidth,
                                            foregroundPixel, backgroundPixel);
    DefineCursor(dsp, dsp->HorScrollBar, &HorizScrollCursor);
    XChangeWindowAttributes(dsp->display_id, dsp->HorScrollBar, CWOverrideRedirect,
                            &Lisp_SetWinAttributes);
    XMapWindow(dsp->display_id, dsp->HorScrollBar);

    dsp->VerScrollButton = XCreateSimpleWindow(
                                               dsp->display_id, dsp->VerScrollBar, 0 - (int)dsp->InternalBorderWidth,      /* x */
                                               (dsp->Visible.y * (int)dsp->Visible.height) / (int)dsp->Display.height, /* y */
                                               dsp->ScrollBarWidth,                                                   /* width */
                                               ((dsp->Visible.height * dsp->Visible.height) / dsp->Display.height) + 1,
                                               dsp->InternalBorderWidth, foregroundPixel, backgroundPixel);
    XChangeWindowAttributes(dsp->display_id, dsp->VerScrollButton, CWOverrideRedirect,
                            &Lisp_SetWinAttributes);
    XSetWindowBackgroundPixmap(dsp->display_id, dsp->VerScrollButton, dsp->ScrollBarPixmap);
    XClearWindow(dsp->display_id, dsp->VerScrollButton);
    XMapWindow(dsp->display_id, dsp->VerScrollButton);

    dsp->HorScrollButton = XCreateSimpleWindow(
                                               dsp->display_id, dsp->HorScrollBar,
                                               (dsp->Visible.x * (int)dsp->Visible.width) / (int)dsp->Display.width,
                                               0 - (int)dsp->InternalBorderWidth, /* y */
                                               ((dsp->Visible.width * dsp->Visible.width) / dsp->Display.width) + 1,
                                               dsp->ScrollBarWidth, dsp->InternalBorderWidth, foregroundPixel,
                                               backgroundPixel);
    XChangeWindowAttributes(dsp->display_id, dsp->HorScrollButton, CWOverrideRedirect,
                            &Lisp_SetWinAttributes);
    XSetWindowBackgroundPixmap(dsp->display_id, dsp->HorScrollButton, dsp->ScrollBarPixmap);
    XClearWindow(dsp->display_id, dsp->HorScrollButton);
    XMapWindow(dsp->display_id, dsp->HorScrollButton);

    dsp->NWGrav = XCreateSimpleWindow(dsp->display_id, dsp->LispWindow, (int)Col2, (int)Row2, GravSize,
                                      GravSize, dsp->InternalBorderWidth, foregroundPixel,
                                      backgroundPixel);
    XSetWindowBackgroundPixmap(dsp->display_id, dsp->NWGrav, dsp->GravityOnPixmap);
    DefineCursor(dsp, dsp->NWGrav, &DefaultCursor);
    XChangeWindowAttributes(dsp->display_id, dsp->NWGrav, CWOverrideRedirect, &Lisp_SetWinAttributes);
    XClearWindow(dsp->display_id, dsp->NWGrav);
    XMapWindow(dsp->display_id, dsp->NWGrav);

    dsp->SEGrav = XCreateSimpleWindow(dsp->display_id, dsp->LispWindow, (int)Col3, (int)Row3, GravSize,
                                      GravSize, dsp->InternalBorderWidth, foregroundPixel,
                                      backgroundPixel);
    XSetWindowBackgroundPixmap(dsp->display_id, dsp->SEGrav, dsp->GravityOffPixmap);
    DefineCursor(dsp, dsp->SEGrav, &DefaultCursor);
    XChangeWindowAttributes(dsp->display_id, dsp->SEGrav, CWOverrideRedirect, &Lisp_SetWinAttributes);
    XClearWindow(dsp->display_id, dsp->NWGrav);
    XMapWindow(dsp->display_id, dsp->SEGrav);

    dsp->SWGrav = XCreateSimpleWindow(dsp->display_id, dsp->LispWindow, (int)Col2, (int)Row3, GravSize,
                                      GravSize, dsp->InternalBorderWidth, foregroundPixel,
                                      backgroundPixel);
    XSetWindowBackgroundPixmap(dsp->display_id, dsp->SWGrav, dsp->GravityOffPixmap);
    DefineCursor(dsp, dsp->SWGrav, &DefaultCursor);
    XClearWindow(dsp->display_id, dsp->NWGrav);
    XMapWindow(dsp->display_id, dsp->SWGrav);

    dsp->NEGrav = XCreateSimpleWindow(dsp->display_id, dsp->LispWindow, (int)Col3, (int)Row2, GravSize,
                                      GravSize, dsp->InternalBorderWidth, foregroundPixel,
                                      backgroundPixel);
    XSetWindowBackgroundPixmap(dsp->display_id, dsp->NEGrav, dsp->GravityOffPixmap);
    DefineCursor(dsp, dsp->NEGrav, &DefaultCursor);
    XClearWindow(dsp->display_id, dsp->NWGrav);
    XMapWindow(dsp->display_id, dsp->NEGrav);
  }
  /* DefineCursor( dsp, dsp->DisplayWindow, &WaitCursor ); */

  XLOCK;
  XMapWindow(dsp->display_id, dsp->LispWindow);
  XFlush(dsp->display_id);
  XUNLOCK(dsp);
}